

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::ReadNames
               (Section *section,IndexedNames *func_names,IndexedNames *dataseg_names,
               RangeSink *sink)

{
  string_view name_00;
  bool bVar1;
  byte bVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  char *pcVar5;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  string_view sVar6;
  IndexedNames *names;
  string_view name;
  uint32_t name_len;
  uint32_t index;
  string_view entry;
  uint32_t i;
  uint32_t count;
  string_view section_1;
  uint32_t size;
  NameType type;
  string_view data;
  string_view *in_stack_fffffffffffffed8;
  mapped_type *in_stack_fffffffffffffee0;
  undefined1 *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  RangeSink *in_stack_ffffffffffffff20;
  string_view in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  size_t local_88;
  char *local_80;
  string_view local_78;
  uint32_t local_68;
  uint32_t local_64;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  uint local_50;
  uint local_4c;
  string_view local_48;
  uint32_t local_38;
  uint local_34;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  char *local_18;
  char *local_10;
  
  local_30._M_len = *(size_t *)(in_RDI + 0x38);
  local_30._M_str = *(char **)(in_RDI + 0x40);
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_30),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar2 = ReadVarUInt7((string_view *)0x1dbf2c);
    local_34 = (uint)bVar2;
    local_38 = ReadVarUInt32((string_view *)0x1dbf43);
    local_48 = ReadPiece((size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if ((local_34 == 1) || (local_34 == 9)) {
      local_4c = ReadVarUInt32((string_view *)0x1dbf95);
      for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
        local_60._M_len = local_48._M_len;
        local_60._M_str = local_48._M_str;
        local_64 = ReadVarUInt32((string_view *)0x1dbfe8);
        local_68 = ReadVarUInt32((string_view *)0x1dbffc);
        local_78 = ReadPiece((size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_78);
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_60);
        pcVar5 = pvVar3 + -(long)pvVar4;
        std::basic_string_view<char,_std::char_traits<char>_>::size(&local_78);
        sVar6._M_str = pcVar5;
        sVar6._M_len = (size_t)pvVar3;
        sVar6 = StrictSubstr(sVar6,(size_t)in_stack_fffffffffffffef0,
                             (size_t)in_stack_fffffffffffffee8);
        local_88 = sVar6._M_len;
        local_60._M_len = local_88;
        local_80 = sVar6._M_str;
        local_60._M_str = local_80;
        name_00._M_str = in_stack_ffffffffffffff40;
        name_00._M_len = in_stack_ffffffffffffff38;
        RangeSink::AddFileRange
                  (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,name_00,
                   in_stack_ffffffffffffff28);
        in_stack_fffffffffffffef0 = local_18;
        if (local_34 == 1) {
          in_stack_fffffffffffffef0 = local_10;
        }
        in_stack_fffffffffffffee8 = &stack0xffffffffffffff1f;
        in_stack_ffffffffffffff40 = in_stack_fffffffffffffef0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        in_stack_fffffffffffffee0 =
             std::
             unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8);
        std::__cxx11::string::operator=
                  ((string *)in_stack_fffffffffffffee0,(string *)&stack0xffffffffffffff20);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
      }
    }
  }
  return;
}

Assistant:

void ReadNames(const Section& section, IndexedNames* func_names,
               IndexedNames* dataseg_names, RangeSink* sink) {
  enum class NameType {
    kModule = 0,
    kFunction = 1,
    kLocal = 2,
    kLabel = 3,
    kType = 4,
    kTable = 5,
    kMemory = 6,
    kGlobal = 7,
    kElemSegment = 8,
    kDataSegment = 9
  };

  string_view data = section.contents;

  while (!data.empty()) {
    NameType type = static_cast<NameType>(ReadVarUInt7(&data));
    uint32_t size = ReadVarUInt32(&data);
    string_view section = ReadPiece(size, &data);

    if (type == NameType::kFunction || type == NameType::kDataSegment) {
      uint32_t count = ReadVarUInt32(&section);
      for (uint32_t i = 0; i < count; i++) {
        string_view entry = section;
        uint32_t index = ReadVarUInt32(&section);
        uint32_t name_len = ReadVarUInt32(&section);
        string_view name = ReadPiece(name_len, &section);
        entry = StrictSubstr(entry, 0, name.data() - entry.data() + name.size());
        sink->AddFileRange("wasm_funcname", name, entry);
        IndexedNames *names = (type == NameType::kFunction ? func_names : dataseg_names);
        (*names)[index] = std::string(name);
      }
    }
  }
}